

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O2

bool cdftocsv::getrec(char *rec_,FILE *stream,int recsize_)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0; recsize_ != (int)lVar2; lVar2 = lVar2 + 1) {
    iVar1 = getc((FILE *)stream);
    if (iVar1 == -1) break;
    rec_[lVar2] = (char)iVar1;
  }
  return recsize_ == (int)lVar2;
}

Assistant:

bool getrec(char *rec_, FILE *stream, int recsize_)
	{
		int totalread = 0;
		while (totalread != recsize_) {
			int ch = getc(stream);
			if (ch == EOF) {
				return false;
			}
			*rec_ = ch;
			totalread++;
			rec_++;
		}

		return true;

	}